

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void env_free(Environment *env)

{
  ObjectType OVar1;
  Record *pRVar2;
  Object o;
  undefined8 unaff_RBX;
  Record *rec;
  Record *__ptr;
  
  __ptr = env->front;
  while (__ptr != (Record *)0x0) {
    pRVar2 = __ptr->next;
    OVar1 = (__ptr->object).type;
    if (OVar1 == OBJECT_INSTANCE) {
      o.field_1.routine.code.statements = (Statement *)unaff_RBX;
      o._0_56_ = (__ptr->object).field_1;
      gc_obj(o);
    }
    else if (OVar1 == OBJECT_ARRAY) {
      free((__ptr->object).field_1.arr.values);
    }
    free(__ptr);
    env->front = pRVar2;
    __ptr = pRVar2;
  }
  free(env);
  return;
}

Assistant:

void env_free(Environment *env){
    while(env->front != NULL){
        Record *rec = env->front;
        Record *bak = rec->next;
        if(rec->object.type == OBJECT_ARRAY)
            memfree(rec->object.arr.values);
        else if(rec->object.type == OBJECT_INSTANCE){
            gc_rec(rec);
        }
        //        memfree(rec->name);
        memfree(rec);
        env->front = bak;
    }
    memfree(env);
}